

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popt.c
# Opt level: O1

int poptAddItem(poptContext con,poptItem newItem,int flags)

{
  int iVar1;
  void *pvVar2;
  size_t sVar3;
  char *pcVar4;
  long lVar5;
  char *__size;
  char *pcVar6;
  long lVar7;
  undefined8 *puVar8;
  
  if (flags == 1) {
    lVar5 = 0x2d0;
    lVar7 = 0x2c8;
  }
  else {
    if (flags != 0) {
      return 1;
    }
    lVar5 = 0x2c0;
    lVar7 = 0x2b8;
  }
  __size = (char *)((long)*(int *)((long)&con->optionStack[0].argc + lVar5) * 0x40 + 0x40);
  pvVar2 = realloc(*(void **)((long)&con->optionStack[0].argc + lVar7),(size_t)__size);
  if (pvVar2 == (void *)0x0) {
    return 1;
  }
  *(void **)((long)&con->optionStack[0].argc + lVar7) = pvVar2;
  iVar1 = *(int *)((long)&con->optionStack[0].argc + lVar5);
  pcVar6 = (newItem->option).longName;
  if (pcVar6 == (char *)0x0) {
    pcVar4 = (char *)0x0;
LAB_00105356:
    puVar8 = (undefined8 *)((long)pvVar2 + (long)iVar1 * 0x40);
    *puVar8 = pcVar4;
    *(char *)(puVar8 + 1) = (newItem->option).shortName;
    *(uint *)((long)puVar8 + 0xc) = (newItem->option).argInfo;
    puVar8[2] = (newItem->option).arg;
    *(int *)(puVar8 + 3) = (newItem->option).val;
    pcVar6 = (newItem->option).descrip;
    if (pcVar6 == (char *)0x0) {
      pcVar4 = (char *)0x0;
    }
    else {
      sVar3 = strlen(pcVar6);
      sVar3 = sVar3 + 1;
      pcVar4 = (char *)malloc(sVar3);
      if (pcVar4 == (char *)0x0) goto LAB_00105432;
      strcpy(pcVar4,pcVar6);
      __size = pcVar6;
    }
    puVar8[4] = pcVar4;
    pcVar6 = (newItem->option).argDescrip;
    if (pcVar6 == (char *)0x0) {
      pcVar4 = (char *)0x0;
    }
    else {
      sVar3 = strlen(pcVar6);
      sVar3 = sVar3 + 1;
      pcVar4 = (char *)malloc(sVar3);
      if (pcVar4 == (char *)0x0) goto LAB_00105437;
      strcpy(pcVar4,pcVar6);
    }
    puVar8[5] = pcVar4;
    *(int *)(puVar8 + 6) = newItem->argc;
    puVar8[7] = newItem->argv;
    *(int *)((long)&con->optionStack[0].argc + lVar5) = iVar1 + 1;
    return 0;
  }
  sVar3 = strlen(pcVar6);
  sVar3 = sVar3 + 1;
  pcVar4 = (char *)malloc(sVar3);
  if (pcVar4 != (char *)0x0) {
    strcpy(pcVar4,pcVar6);
    __size = pcVar6;
    goto LAB_00105356;
  }
  poptAddItem_cold_1();
LAB_00105432:
  poptAddItem_cold_2();
LAB_00105437:
  poptAddItem_cold_3();
  if (sVar3 == 0) {
    return 0;
  }
  if (*(long *)(sVar3 + 0x2d8) == 0) {
    if (((ulong)__size & 1) == 0) {
      sVar3 = *(size_t *)(sVar3 + 0x280);
    }
    return (int)*(undefined8 *)(*(long *)(sVar3 + 8) + -8 + (long)*(int *)(sVar3 + 0x18) * 8);
  }
  return (int)*(long *)(sVar3 + 0x2d8);
}

Assistant:

int poptAddItem(poptContext con, poptItem newItem, int flags)
{
    poptItem * items, item_tmp, item;
    int * nitems;

    switch (flags) {
    case 1:
	items = &con->execs;
	nitems = &con->numExecs;
	break;
    case 0:
	items = &con->aliases;
	nitems = &con->numAliases;
	break;
    default:
	return 1;
	break;
    }

    item_tmp = realloc((*items), ((*nitems) + 1) * sizeof(**items));
    if (item_tmp == NULL)
	return 1;
    *items = item_tmp;

    item = (*items) + (*nitems);

    item->option.longName =
	(newItem->option.longName ? xstrdup(newItem->option.longName) : NULL);
    item->option.shortName = newItem->option.shortName;
    item->option.argInfo = newItem->option.argInfo;
    item->option.arg = newItem->option.arg;
    item->option.val = newItem->option.val;
    item->option.descrip =
	(newItem->option.descrip ? xstrdup(newItem->option.descrip) : NULL);
    item->option.argDescrip =
       (newItem->option.argDescrip ? xstrdup(newItem->option.argDescrip) : NULL);
    item->argc = newItem->argc;
    item->argv = newItem->argv;

    (*nitems)++;

    return 0;
}